

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

void spawn_stdin_stdout(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  uv__queue *__n;
  int *piVar3;
  uv__queue *puVar4;
  char *__s;
  size_t sVar5;
  uv_loop_t *puVar6;
  uv_handle_t *handle;
  uv_loop_t *unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  char buf [1024];
  undefined1 auStack_458 [24];
  uv_loop_t *puStack_440;
  uv__queue *local_438;
  uv__queue *local_430;
  uv_loop_t local_428;
  
LAB_001c07fd:
  puStack_440 = (uv_loop_t *)0x1c080c;
  __n = (uv__queue *)read(0,&local_428,0x400);
  if (__n == (uv__queue *)0xffffffffffffffff) goto code_r0x001c0815;
  goto LAB_001c081f;
code_r0x001c0815:
  puStack_440 = (uv_loop_t *)0x1c081a;
  piVar3 = __errno_location();
  if (*piVar3 != 4) {
LAB_001c081f:
    if (__n == (uv__queue *)0x0) {
      return;
    }
    local_438 = (uv__queue *)0x0;
    puVar6 = unaff_R15;
    local_430 = __n;
    puVar1 = &local_428;
    if ((long)__n < 1) goto LAB_001c08a8;
    for (; puVar6 = puVar1, local_438 = (uv__queue *)0x0, __n != (uv__queue *)0x0;
        __n = (uv__queue *)((long)__n - (long)puVar4)) {
      do {
        puStack_440 = (uv_loop_t *)0x1c0854;
        puVar4 = (uv__queue *)write(1,puVar6,(size_t)__n);
        if (puVar4 != (uv__queue *)0xffffffffffffffff) break;
        puStack_440 = (uv_loop_t *)0x1c0862;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      local_438 = (uv__queue *)0x0;
      local_430 = puVar4;
      if ((long)puVar4 < 0) {
        puStack_440 = (uv_loop_t *)0x1c08a8;
        spawn_stdin_stdout_cold_2();
        goto LAB_001c08a8;
      }
      unaff_R15 = (uv_loop_t *)
                  ((long)((uv_loop_t *)(puVar6->reserved + -7))->reserved + (long)&puVar4[-4].prev);
      puVar1 = unaff_R15;
    }
  }
  goto LAB_001c07fd;
LAB_001c08a8:
  puStack_440 = (uv_loop_t *)run_test_spawn_relative_path;
  spawn_stdin_stdout_cold_1();
  auStack_458._8_8_ = &local_428;
  auStack_458._16_8_ = __n;
  puStack_440 = puVar6;
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar2 = uv_exepath(exepath,&exepath_size);
  auStack_458._0_8_ = SEXT48(iVar2);
  if ((void *)auStack_458._0_8_ == (void *)0x0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      __s = strrchr(exepath,0x5c);
    }
    if (__s == (char *)0x0) goto LAB_001c0aa5;
    sVar5 = strlen(__s);
    memmove(__s + 2,__s,sVar5 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    puVar6 = uv_default_loop();
    iVar2 = uv_spawn(puVar6,&process,&options);
    auStack_458._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_458._0_8_ != (void *)0x0) goto LAB_001c0aaa;
    puVar6 = uv_default_loop();
    iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
    auStack_458._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_458._0_8_ != (void *)0x0) goto LAB_001c0ab7;
    auStack_458._0_8_ = (void *)0x1;
    if (exit_cb_called != 1) goto LAB_001c0ac4;
    auStack_458._0_8_ = (void *)0x1;
    if (close_cb_called == 1) {
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      auStack_458._0_8_ = (void *)0x0;
      puVar6 = uv_default_loop();
      iVar2 = uv_loop_close(puVar6);
      if ((void *)auStack_458._0_8_ == (void *)(long)iVar2) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001c0ade;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c0aa5:
    run_test_spawn_relative_path_cold_7();
LAB_001c0aaa:
    run_test_spawn_relative_path_cold_2();
LAB_001c0ab7:
    run_test_spawn_relative_path_cold_3();
LAB_001c0ac4:
    run_test_spawn_relative_path_cold_4();
  }
  run_test_spawn_relative_path_cold_5();
LAB_001c0ade:
  handle = (uv_handle_t *)auStack_458;
  run_test_spawn_relative_path_cold_6();
  iVar2 = uv_is_closing(handle);
  if (iVar2 == 0) {
    uv_close(handle,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT_GT(r, 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT_GE(w, 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}